

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void do_forcewear(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *astr;
  CHAR_DATA *ch_00;
  OBJ_DATA *obj;
  char arg1 [4608];
  char acStack_1218 [4608];
  
  astr = one_argument(argument,acStack_1218);
  bVar1 = str_cmp(acStack_1218,"");
  if ((((bVar1) && (bVar1 = str_cmp(astr,""), bVar1)) &&
      (ch_00 = get_char_room(ch,acStack_1218), ch_00 != (CHAR_DATA *)0x0)) &&
     (obj = get_obj_carry(ch,astr,ch), obj != (OBJ_DATA *)0x0)) {
    obj_from_char(obj);
    obj_to_char(obj,ch_00);
    act("You put $p on $N.",ch,obj,ch_00,3);
    act("$n puts $p on you.",ch,obj,ch_00,2);
    act("$n puts $p on $N.",ch,obj,ch_00,1);
    do_wear(ch_00,obj->name);
    return;
  }
  send_to_char("forcewear <character> <item in your inv>\n\r",ch);
  return;
}

Assistant:

void do_forcewear(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL];
	CHAR_DATA *victim;
	OBJ_DATA *obj;

	argument = one_argument(argument, arg1);

	if (!str_cmp(arg1, "")
		|| !str_cmp(argument, "")
		|| !(victim = get_char_room(ch, arg1))
		|| !(obj = get_obj_carry(ch, argument, ch)))
	{
		send_to_char("forcewear <character> <item in your inv>\n\r", ch);
		return;
	}

	obj_from_char(obj);
	obj_to_char(obj, victim);

	act("You put $p on $N.", ch, obj, victim, TO_CHAR);
	act("$n puts $p on you.", ch, obj, victim, TO_VICT);
	act("$n puts $p on $N.", ch, obj, victim, TO_NOTVICT);

	do_wear(victim, obj->name);
}